

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread.c
# Opt level: O1

void p_uthread_unref(PUThread *thread)

{
  pboolean pVar1;
  
  if (thread != (PUThread *)0x0) {
    pVar1 = p_atomic_int_dec_and_test((pint *)thread);
    if (pVar1 == 1) {
      p_free((thread->base).name);
      if ((thread->base).ours == 1) {
        p_uthread_free_internal(thread);
        return;
      }
      p_free(thread);
      return;
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_uthread_unref (PUThread *thread)
{
	PUThreadBase *base_thread;

	if (P_UNLIKELY (thread == NULL))
		return;

	base_thread = (PUThreadBase *) thread;

	if (p_atomic_int_dec_and_test (&base_thread->ref_count) == TRUE) {
		p_free (base_thread->name);

		if (base_thread->ours == TRUE)
			p_uthread_free_internal (thread);
		else
			p_free (thread);
	}
}